

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O0

void osThread::USleep(unsigned_long us,char *file,int line)

{
  osThread *poVar1;
  osThread *thread;
  int line_local;
  char *file_local;
  unsigned_long us_local;
  
  poVar1 = GetCurrent();
  if (poVar1 == (osThread *)0x0) {
    usleep((__useconds_t)us);
  }
  else {
    poVar1->Filename = file;
    poVar1->Linenumber = line;
    poVar1->USleepTime = us;
    usleep((__useconds_t)us);
    poVar1->USleepTime = 0;
  }
  return;
}

Assistant:

void osThread::USleep(unsigned long us, const char* file, int line)
{
    osThread* thread = GetCurrent();

    if (thread != nullptr)
    {
        thread->Filename = file;
        thread->Linenumber = line;

        thread->USleepTime = us;
#ifdef _WIN32
        SleepEx(us / 1000, true);
#elif __linux__
        usleep(us);
#endif
        thread->USleepTime = 0;
    }
    else
    {
#ifdef _WIN32
        SleepEx(us / 1000, true);
#elif __linux__
        usleep(us);
#endif
    }
}